

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_deserializer.hpp
# Opt level: O2

unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
__thiscall
duckdb::BinaryDeserializer::Deserialize<duckdb::ExtensionInstallInfo>
          (BinaryDeserializer *this,ReadStream *stream)

{
  BinaryDeserializer deserializer;
  BinaryDeserializer local_2a0;
  
  BinaryDeserializer(&local_2a0,stream);
  Deserialize<duckdb::ExtensionInstallInfo>(this);
  Deserializer::~Deserializer(&local_2a0.super_Deserializer);
  return (unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
          )(unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
            )this;
}

Assistant:

static unique_ptr<T> Deserialize(ReadStream &stream) {
		BinaryDeserializer deserializer(stream);
		return deserializer.template Deserialize<T>();
	}